

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_sequence_containers.h
# Opt level: O1

output_type
testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::generate
          (size_t generation,unsigned_long randomSeed)

{
  ulong in_RSI;
  _Fwd_list_base<int,_std::allocator<int>_> in_RDI;
  anon_class_16_2_2856ea55 __gen;
  unsigned_long local_20;
  size_t local_18;
  
  *(undefined8 *)in_RDI._M_impl._M_head._M_next = 0;
  if (in_RSI != 0) {
    __gen.randomSeed = &local_20;
    __gen.generation = &local_18;
    ::std::
    generate_n<std::front_insert_iterator<std::forward_list<int,std::allocator<int>>>,unsigned_long,testinator::Arbitrary<std::forward_list<int,std::allocator<int>>>::generate(unsigned_long,unsigned_long)::_lambda()_1_>
              ((front_insert_iterator<std::forward_list<int,_std::allocator<int>_>_>)
               in_RDI._M_impl._M_head._M_next,(in_RSI / 100) * 5 + 5,__gen);
  }
  return (output_type)(_Fwd_list_node_base)in_RDI._M_impl._M_head._M_next;
}

Assistant:

static output_type generate(std::size_t generation, unsigned long int randomSeed)
    {
      output_type v;
      if (generation == 0) return v;
      std::size_t n = N * ((generation / 100) + 1);
      std::generate_n(std::front_inserter(v), n,
                      [&] () { return Arbitrary<T>::generate(generation++, randomSeed++); });
      return v;
    }